

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

void vkt::QueryPool::anon_unknown_0::submitCommandsAndWait
               (DeviceInterface *vk,VkDevice device,VkQueue queue,VkCommandBuffer commandBuffer)

{
  Handle<(vk::HandleType)6> HVar1;
  VkResult VVar2;
  VkFenceCreateInfo fenceInfo;
  VkSubmitInfo submitInfo;
  VkFence local_c8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_c0;
  VkCommandBuffer local_a0;
  VkFenceCreateInfo local_98;
  Move<vk::Handle<(vk::HandleType)6>_> local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  VkCommandBuffer *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_98.flags = 0;
  local_98._20_4_ = 0;
  local_98.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.pNext = (void *)0x0;
  local_a0 = commandBuffer;
  ::vk::createFence(&local_78,vk,device,&local_98,(VkAllocationCallbacks *)0x0);
  HVar1.m_internal = local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
  ;
  DStack_c0.m_device._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device._0_4_;
  DStack_c0.m_device._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device._4_4_;
  DStack_c0.m_allocator._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._0_4_;
  DStack_c0.m_allocator._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator._4_4_;
  local_c8.m_internal =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  DStack_c0.m_deviceIface =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58 = 0;
  uStack_40 = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_38 = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 4;
  uStack_50 = 1;
  local_48 = &local_a0;
  VVar2 = (*vk->_vptr_DeviceInterface[2])(vk,queue,1,&local_78,HVar1.m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0xae);
  VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_c8,1,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0xaf);
  if (local_c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_c0,local_c8);
  }
  return;
}

Assistant:

void submitCommandsAndWait (const DeviceInterface&	vk,
							const VkDevice			device,
							const VkQueue			queue,
							const VkCommandBuffer	commandBuffer)
{
	const VkFenceCreateInfo	fenceInfo	=
	{
		VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// VkStructureType		sType;
		DE_NULL,								// const void*			pNext;
		(VkFenceCreateFlags)0,					// VkFenceCreateFlags	flags;
	};
	const Unique<VkFence>	fence		(createFence(vk, device, &fenceInfo));

	const VkSubmitInfo		submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
		DE_NULL,						// const void*					pNext;
		0u,								// uint32_t						waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
		DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,								// uint32_t						commandBufferCount;
		&commandBuffer,					// const VkCommandBuffer*		pCommandBuffers;
		0u,								// uint32_t						signalSemaphoreCount;
		DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
	};
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
}